

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

filemgr * get_instance_UNLOCKED(char *filename)

{
  hash_elem *phVar1;
  filemgr *pfVar2;
  filemgr query;
  hash_elem local_200 [21];
  
  if (filename != (char *)0x0) {
    phVar1 = hash_find(&hash,local_200);
    pfVar2 = (filemgr *)(phVar1 + -10);
    if (phVar1 == (hash_elem *)0x0) {
      pfVar2 = (filemgr *)0x0;
    }
    return pfVar2;
  }
  return (filemgr *)0x0;
}

Assistant:

static filemgr* get_instance_UNLOCKED(const char *filename)
{
    if (!filename) {
        return NULL;
    }

    struct filemgr query;
    struct hash_elem *e = NULL;
    struct filemgr *file = NULL;

    query.filename = (char*)filename;
    e = hash_find(&hash, &query.e);
    if (e) {
        file = _get_entry(e, struct filemgr, e);
    }
    return file;
}